

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O3

uint RDL_getRCyclesForURF(RDL_data *data,uint index,RDL_cycle ***ptr)

{
  uint uVar1;
  RDL_cycleIterator *ptr_00;
  RDL_cycle **ppRVar2;
  RDL_cycleIterator *it;
  
  ptr_00 = RDL_getRCyclesForURFIterator(data,index);
  if (ptr_00 != (RDL_cycleIterator *)0x0) {
    uVar1 = RDL_getRCycles_internal((RDL_data *)ptr,(RDL_cycle ***)ptr_00,it);
    return uVar1;
  }
  (*RDL_outputFunc)(RDL_ERROR,"Iterator is NULL!\n");
  ppRVar2 = (RDL_cycle **)malloc(8);
  *ptr = ppRVar2;
  return 0xffffffff;
}

Assistant:

unsigned RDL_getRCyclesForURF(const RDL_data *data, unsigned index, RDL_cycle ***ptr)
{
  RDL_cycleIterator* it;

  it = RDL_getRCyclesForURFIterator(data, index);

  if (it == NULL) {
    RDL_outputFunc(RDL_ERROR, "Iterator is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  return RDL_getRCycles_internal(data, ptr, it);
}